

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_init.c
# Opt level: O2

void luaL_openlibs(lua_State *L)

{
  lua_CFunction *pp_Var1;
  
  for (pp_Var1 = &lj_lib_load[0].func; *pp_Var1 != (lua_CFunction)0x0; pp_Var1 = pp_Var1 + 2) {
    lua_pushcclosure(L,*pp_Var1,0);
    lua_pushstring(L,((luaL_Reg *)(pp_Var1 + -1))->name);
    lua_call(L,1,0);
  }
  luaL_findtable(L,-10000,"_PRELOAD",1);
  for (pp_Var1 = &lj_lib_preload[0].func; *pp_Var1 != (lua_CFunction)0x0; pp_Var1 = pp_Var1 + 2) {
    lua_pushcclosure(L,*pp_Var1,0);
    lua_setfield(L,-2,((luaL_Reg *)(pp_Var1 + -1))->name);
  }
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_openlibs(lua_State *L)
{
  const luaL_Reg *lib;
  for (lib = lj_lib_load; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_pushstring(L, lib->name);
    lua_call(L, 1, 0);
  }
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD",
		 sizeof(lj_lib_preload)/sizeof(lj_lib_preload[0])-1);
  for (lib = lj_lib_preload; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_setfield(L, -2, lib->name);
  }
  lua_pop(L, 1);
}